

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetLinearSolverB(void *cvode_mem,int which,SUNLinearSolver LS,SUNMatrix A)

{
  int iVar1;
  undefined8 *__ptr;
  int iVar2;
  int error_code;
  char *msgfmt;
  int *piVar3;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    iVar1 = 0x810;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar2 = -0x65;
    error_code = -0x65;
    iVar1 = 0x819;
  }
  else if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
    for (piVar3 = *(int **)(*(long *)((long)cvode_mem + 0xa70) + 0x30); piVar3 != (int *)0x0;
        piVar3 = *(int **)(piVar3 + 0x1e)) {
      if (*piVar3 == which) goto LAB_00129b2b;
    }
    piVar3 = (int *)0x0;
LAB_00129b2b:
    __ptr = (undefined8 *)malloc(0x68);
    if (__ptr != (undefined8 *)0x0) {
      __ptr[4] = 0;
      __ptr[5] = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      *__ptr = 0;
      __ptr[1] = 0;
      __ptr[8] = 0;
      __ptr[9] = 0;
      __ptr[10] = 0;
      __ptr[0xb] = 0;
      __ptr[0xc] = 0;
      if (*(code **)(piVar3 + 0x14) != (code *)0x0) {
        (**(code **)(piVar3 + 0x14))(piVar3);
      }
      *(undefined8 **)(piVar3 + 0x12) = __ptr;
      *(code **)(piVar3 + 0x14) = cvLsFreeB;
      iVar1 = CVodeSetLinearSolver(*(void **)(piVar3 + 4),LS,A);
      if (iVar1 != 0) {
        free(__ptr);
        return iVar1;
      }
      return 0;
    }
    msgfmt = "A memory request failed.";
    iVar2 = -4;
    error_code = -4;
    iVar1 = 0x834;
  }
  else {
    msgfmt = "Illegal value for which.";
    iVar2 = -3;
    error_code = -3;
    iVar1 = 0x822;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVodeSetLinearSolverB",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVodeSetLinearSolverB(void* cvode_mem, int which, SUNLinearSolver LS,
                          SUNMatrix A)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSG_LS_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  /* Get memory for CVLsMemRecB */
  cvlsB_mem = NULL;
  cvlsB_mem = (CVLsMemB)malloc(sizeof(struct CVLsMemRecB));
  if (cvlsB_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize Jacobian and preconditioner functions */
  cvlsB_mem->jacB      = NULL;
  cvlsB_mem->jacBS     = NULL;
  cvlsB_mem->jtsetupB  = NULL;
  cvlsB_mem->jtsetupBS = NULL;
  cvlsB_mem->jtimesB   = NULL;
  cvlsB_mem->jtimesBS  = NULL;
  cvlsB_mem->psetB     = NULL;
  cvlsB_mem->psetBS    = NULL;
  cvlsB_mem->psolveB   = NULL;
  cvlsB_mem->psolveBS  = NULL;
  cvlsB_mem->P_dataB   = NULL;

  /* free any existing system solver attached to cvB */
  if (cvB_mem->cv_lfree) { cvB_mem->cv_lfree(cvB_mem); }

  /* Attach lmemB data and lfreeB function. */
  cvB_mem->cv_lmem  = cvlsB_mem;
  cvB_mem->cv_lfree = cvLsFreeB;

  /* set the linear solver for this backward problem */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  retval     = CVodeSetLinearSolver(cvodeB_mem, LS, A);
  if (retval != CVLS_SUCCESS)
  {
    free(cvlsB_mem);
    cvlsB_mem = NULL;
  }

  return (retval);
}